

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

void __thiscall doctest::detail::Result::Result(Result *this,bool passed,String *decomposition)

{
  this->m_passed = passed;
  String::copy(&this->m_decomp,(EVP_PKEY_CTX *)decomposition,(EVP_PKEY_CTX *)decomposition);
  return;
}

Assistant:

Result::Result(bool passed, const String& decomposition)
            : m_passed(passed)
            , m_decomp(decomposition) {}